

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int ncnn::deconvolutiondepthwise
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,int group,
              int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  int i;
  uint uVar8;
  int iVar9;
  int iVar10;
  int extraout_EAX;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  size_type __n;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  int k;
  ulong uVar24;
  void *pvVar25;
  int i_3;
  void *pvVar26;
  ulong uVar27;
  ulong uVar28;
  int i_1;
  bool bVar29;
  undefined4 uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_160;
  allocator_type local_141;
  ulong local_140;
  void *local_138;
  void *local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [16];
  ulong local_108;
  void *local_100;
  void *local_f8;
  long local_f0;
  void *local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  Mat *local_b0;
  Mat *local_a8;
  Mat *local_a0;
  long local_98;
  long local_90;
  undefined1 local_88 [16];
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  void *local_58;
  long local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar13 = bottom_blob->c;
  iVar10 = top_blob->w;
  uVar8 = kernel_h * kernel_w;
  __n = (size_type)(int)uVar8;
  iVar2 = top_blob->c;
  local_b0 = bias_data;
  local_a8 = weight_data;
  local_a0 = top_blob;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_141);
  iVar9 = 0;
  iVar7 = kernel_w;
  if (kernel_w < 1) {
    iVar7 = iVar9;
  }
  if (kernel_h < 1) {
    kernel_h = iVar9;
  }
  iVar16 = 0;
  iVar19 = 0;
  iVar12 = iVar7;
  for (; iVar9 != kernel_h; iVar9 = iVar9 + 1) {
    for (lVar22 = (long)iVar19; iVar12 != lVar22; lVar22 = lVar22 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar22] = iVar16;
      iVar16 = iVar16 + dilation_w;
    }
    iVar16 = iVar16 + (iVar10 * dilation_h - dilation_w * kernel_w);
    iVar12 = iVar12 + iVar7;
    iVar19 = iVar7 + iVar19;
  }
  local_90 = (long)stride_w;
  if (iVar2 == group && iVar13 == group) {
    local_128 = bottom_blob->cstep * bottom_blob->elemsize;
    iVar13 = local_a0->w;
    local_d0 = local_a0->elemsize;
    local_120 = local_a0->cstep * local_d0;
    local_130 = (void *)((long)local_a0->h * (long)iVar13);
    local_d8 = local_d0 * (long)local_130 + 0xf & 0xfffffffffffffff0;
    local_100 = local_b0->data;
    uVar17 = local_a0->h * iVar13;
    uVar20 = 0;
    uVar27 = 0;
    if (0 < (int)uVar8) {
      uVar27 = (ulong)uVar8;
    }
    uVar8 = bottom_blob->w;
    local_c8 = (ulong)(int)uVar8;
    uVar18 = 0;
    if (0 < (int)uVar8) {
      uVar18 = (ulong)uVar8;
    }
    uVar28 = (ulong)(uint)bottom_blob->h;
    if (bottom_blob->h < 1) {
      uVar28 = uVar20;
    }
    local_140 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      local_140 = uVar20;
    }
    local_108 = (ulong)(uint)group;
    if (group < 1) {
      local_108 = uVar20;
    }
    local_138 = (void *)((long)iVar13 * local_d0 * (long)stride_h);
    local_e0 = CONCAT71(local_e0._1_7_,
                        (long)local_b0->c * local_b0->cstep == 0 || local_100 == (void *)0x0);
    local_e8 = bottom_blob->data;
    pvVar26 = local_a8->data;
    local_f0 = CONCAT44(local_f0._4_4_,local_a0->d);
    pvVar21 = local_a0->data;
    iVar13 = local_a0->dims;
    uVar20 = 0;
    local_f8 = pvVar21;
    while (uVar20 != local_108) {
      iVar10 = (int)(local_d8 / local_d0);
      if (iVar13 == 4) {
        iVar10 = (int)local_130;
      }
      uVar30 = 0;
      if ((char)local_e0 == '\0') {
        uVar30 = *(undefined4 *)((long)local_100 + uVar20 * 4);
      }
      local_88._0_8_ = uVar20;
      iVar10 = iVar10 * (int)local_f0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      for (lVar22 = 0; iVar10 != (int)lVar22; lVar22 = lVar22 + 1) {
        *(undefined4 *)((long)pvVar21 + lVar22 * 4) = uVar30;
      }
      for (uVar11 = 0; uVar11 != uVar28; uVar11 = uVar11 + 1) {
        for (uVar23 = 0; uVar23 != uVar18; uVar23 = uVar23 + 1) {
          lVar22 = uVar23 * local_90 * 4 + uVar11 * (long)local_138 + local_120 * uVar20;
          fVar31 = *(float *)((long)local_e8 +
                             uVar23 * 4 + uVar11 * local_c8 * 4 + local_128 * uVar20);
          for (uVar24 = 0; uVar27 != uVar24; uVar24 = uVar24 + 1) {
            *(float *)((long)local_f8 +
                      (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar24] * 4 + lVar22)
                 = *(float *)((long)pvVar26 + uVar24 * 4) * fVar31 +
                   *(float *)((long)local_f8 +
                             (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar24] * 4 +
                             lVar22);
          }
        }
      }
      pfVar3 = (float *)activation_params->data;
      uVar20 = local_140;
      for (uVar11 = 0; uVar20 != uVar11; uVar11 = uVar11 + 1) {
        fVar31 = *(float *)((long)pvVar21 + uVar11 * 4);
        fVar33 = fVar31;
        switch(activation_type) {
        case 1:
          if (fVar31 <= 0.0) {
            fVar33 = 0.0;
          }
          break;
        case 2:
          fVar33 = (float)(~-(uint)(0.0 < fVar31) & (uint)*pfVar3 |
                          -(uint)(0.0 < fVar31) & 0x3f800000) * fVar31;
          break;
        case 3:
          if (fVar31 <= *pfVar3) {
            fVar31 = *pfVar3;
          }
          fVar33 = pfVar3[1];
          if (fVar31 <= pfVar3[1]) {
            fVar33 = fVar31;
          }
          break;
        case 4:
          if (88.37626 <= fVar31) {
            fVar31 = 88.37626;
          }
          fVar31 = expf((float)(-(uint)(fVar31 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar31 < -88.37626) & (uint)-fVar31));
          uVar20 = local_140;
          fVar33 = 1.0 / (fVar31 + 1.0);
          break;
        case 5:
          local_118 = ZEXT416((uint)fVar31);
          fVar31 = expf(fVar31);
          fVar31 = logf(fVar31 + 1.0);
          fVar31 = tanhf(fVar31);
          uVar20 = local_140;
          fVar33 = fVar31 * (float)local_118._0_4_;
          break;
        case 6:
          fVar1 = *pfVar3;
          fVar32 = -pfVar3[1] / fVar1;
          fVar33 = 0.0;
          if ((fVar32 <= fVar31) && (fVar33 = fVar31, fVar31 <= fVar32 + 1.0 / fVar1)) {
            fVar33 = (fVar1 * fVar31 + pfVar3[1]) * fVar31;
          }
        }
        *(float *)((long)pvVar21 + uVar11 * 4) = fVar33;
      }
      pvVar21 = (void *)((long)pvVar21 + local_120);
      pvVar26 = (void *)((long)pvVar26 + __n * 4);
      uVar20 = local_88._0_8_ + 1;
    }
  }
  else {
    uVar20 = (long)iVar13 / (long)group;
    uVar27 = (long)iVar2 / (long)group;
    iVar13 = (int)uVar20;
    uVar18 = 0;
    if (0 < (int)uVar8) {
      uVar18 = (ulong)uVar8;
    }
    uVar28 = 0;
    if (0 < iVar13) {
      uVar28 = uVar20 & 0xffffffff;
    }
    iVar10 = (int)uVar27;
    local_d8 = 0;
    if (0 < iVar10) {
      local_d8 = uVar27 & 0xffffffff;
    }
    local_70 = (long)iVar13;
    if (group < 1) {
      group = 0;
    }
    local_108 = (ulong)(uint)group;
    local_78 = (long)iVar10;
    local_bc = iVar10 * iVar13 * uVar8;
    local_50 = (long)(int)(iVar13 * uVar8) << 2;
    iVar13 = 0;
    local_98 = 0;
    uVar20 = 0;
    local_68 = (long)stride_h;
    while (uVar20 != local_108) {
      local_e0 = uVar20 * local_78;
      iVar10 = local_a0->w;
      local_130 = local_a0->data;
      local_e8 = (void *)local_a0->elemsize;
      local_128 = local_a0->cstep * (long)local_e8;
      local_f0 = (long)local_a0->h * (long)iVar10;
      local_f8 = (void *)((long)local_e8 * local_f0 + 0xfU & 0xfffffffffffffff0);
      local_58 = local_b0->data;
      bVar29 = local_58 != (void *)0x0;
      iVar2 = local_b0->c;
      sVar4 = local_b0->cstep;
      uVar8 = local_a0->h * iVar10;
      lVar22 = uVar20 * local_70;
      uVar27 = (ulong)(uint)bottom_blob->w;
      if (bottom_blob->w < 1) {
        uVar27 = 0;
      }
      uVar17 = bottom_blob->h;
      if (bottom_blob->h < 1) {
        uVar17 = 0;
      }
      local_140 = (ulong)uVar17;
      local_c8 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        local_c8 = 0;
      }
      local_120 = (long)iVar10 * (long)local_e8 * local_68;
      local_160 = (void *)((long)iVar13 * 4 + (long)local_a8->data);
      pvVar26 = (void *)(local_128 * local_98 + (long)local_130);
      local_100 = (void *)CONCAT44(local_100._4_4_,local_a0->d);
      local_b4 = local_a0->dims;
      uVar11 = 0;
      local_b8 = iVar13;
      local_60 = uVar20;
      while (uVar11 != local_d8) {
        iVar13 = (int)((ulong)local_f8 / (ulong)local_e8);
        if (local_b4 == 4) {
          iVar13 = (int)local_f0;
        }
        uVar30 = 0;
        if ((long)iVar2 * sVar4 != 0 && bVar29) {
          uVar30 = *(undefined4 *)((long)local_58 + (uVar11 + local_e0) * 4);
        }
        iVar13 = iVar13 * (int)local_100;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        for (lVar14 = 0; iVar13 != (int)lVar14; lVar14 = lVar14 + 1) {
          *(undefined4 *)((long)pvVar26 + lVar14 * 4) = uVar30;
        }
        for (uVar20 = 0; uVar20 != local_140; uVar20 = uVar20 + 1) {
          for (uVar23 = 0; uVar23 != uVar27; uVar23 = uVar23 + 1) {
            lVar14 = uVar23 * local_90 * 4 + uVar20 * local_120 + (uVar11 + local_e0) * local_128;
            iVar13 = bottom_blob->w;
            sVar5 = bottom_blob->elemsize;
            sVar6 = bottom_blob->cstep;
            pvVar21 = bottom_blob->data;
            pvVar25 = local_160;
            for (uVar24 = 0; uVar24 != uVar28; uVar24 = uVar24 + 1) {
              fVar31 = *(float *)((long)pvVar21 +
                                 (uVar24 + lVar22) * sVar6 * sVar5 +
                                 uVar23 * 4 + (long)iVar13 * uVar20 * sVar5);
              for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
                *(float *)((long)local_130 +
                          (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar15] * 4 +
                          lVar14) =
                     *(float *)((long)pvVar25 + uVar15 * 4) * fVar31 +
                     *(float *)((long)local_130 +
                               (long)local_48._M_impl.super__Vector_impl_data._M_start[uVar15] * 4 +
                               lVar14);
              }
              pvVar25 = (void *)((long)pvVar25 + __n * 4);
            }
          }
        }
        local_118._0_8_ = activation_params->data;
        local_138 = pvVar26;
        local_d0 = uVar11;
        for (uVar20 = 0; local_c8 != uVar20; uVar20 = uVar20 + 1) {
          fVar31 = *(float *)((long)pvVar26 + uVar20 * 4);
          fVar33 = fVar31;
          switch(activation_type) {
          case 1:
            if (fVar31 <= 0.0) {
              fVar33 = 0.0;
            }
            break;
          case 2:
            fVar33 = (float)(~-(uint)(0.0 < fVar31) & (uint)*(float *)local_118._0_8_ |
                            -(uint)(0.0 < fVar31) & 0x3f800000) * fVar31;
            break;
          case 3:
            if (fVar31 <= *(float *)local_118._0_8_) {
              fVar31 = *(float *)local_118._0_8_;
            }
            fVar33 = *(float *)(local_118._0_8_ + 4);
            if (fVar31 <= *(float *)(local_118._0_8_ + 4)) {
              fVar33 = fVar31;
            }
            break;
          case 4:
            if (88.37626 <= fVar31) {
              fVar31 = 88.37626;
            }
            fVar31 = expf((float)(-(uint)(fVar31 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar31 < -88.37626) & (uint)-fVar31));
            pvVar26 = local_138;
            fVar33 = 1.0 / (fVar31 + 1.0);
            break;
          case 5:
            local_88 = ZEXT416((uint)fVar31);
            fVar31 = expf(fVar31);
            fVar31 = logf(fVar31 + 1.0);
            fVar31 = tanhf(fVar31);
            pvVar26 = local_138;
            fVar33 = fVar31 * (float)local_88._0_4_;
            break;
          case 6:
            fVar1 = *(float *)local_118._0_8_;
            fVar32 = -*(float *)(local_118._0_8_ + 4) / fVar1;
            fVar33 = 0.0;
            if ((fVar32 <= fVar31) && (fVar33 = fVar31, fVar31 <= fVar32 + 1.0 / fVar1)) {
              fVar33 = (fVar1 * fVar31 + *(float *)(local_118._0_8_ + 4)) * fVar31;
            }
          }
          *(float *)((long)pvVar26 + uVar20 * 4) = fVar33;
        }
        pvVar26 = (void *)((long)pvVar26 + local_128);
        local_160 = (void *)((long)local_160 + local_50);
        uVar11 = local_d0 + 1;
      }
      local_98 = local_98 + local_78;
      iVar13 = local_b8 + local_bc;
      uVar20 = local_60 + 1;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

static int deconvolutiondepthwise(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (inch == group && group == outch)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat out = top_blob.channel(g);

            const float bias = bias_data.empty() ? 0.f : bias_data[g];

            out.fill(bias);

            // shadowed variable for less openmp task args
            const int w = bottom_blob.w;
            const int h = bottom_blob.h;
            const int outw = top_blob.w;
            const int outh = top_blob.h;

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = out.row(i * stride_h) + j * stride_w;

                    const float val = inptr[i * w + j];

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }
                }
            }

            {
                float* outptr = out;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                }
            }
        }
    }
    else
    {
        const int inch_g = inch / group;
        const int outch_g = outch / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outch_g; p++)
            {
                Mat out = top_blob.channel(g * outch_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * inch_g * outch_g * g;

                const float bias = bias_data.empty() ? 0.f : bias_data[g * outch_g + p];

                out.fill(bias);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int outw = top_blob.w;
                const int outh = top_blob.h;

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i * stride_h) + j * stride_w;

                        const float* kptr = weight_data_ptr + maxk * inch_g * p;

                        for (int q = 0; q < inch_g; q++)
                        {
                            const float val = bottom_blob.channel(inch_g * g + q).row(i)[j];

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[space_ofs[k]] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
                    }
                }
            }
        }
    }

    return 0;
}